

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_diag(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long local_98;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x11c2,"fatal error");
  }
  if (params->ith == 0) {
    uVar2 = pgVar1->ne[0];
    if (uVar2 == dst->ne[0]) {
      if (uVar2 == dst->ne[1]) {
        if (pgVar1->ne[1] == 1) {
          uVar3 = pgVar1->ne[2];
          if (uVar3 == dst->ne[2]) {
            uVar4 = pgVar1->ne[3];
            if (uVar4 == dst->ne[3]) {
              if (pgVar1->nb[0] == 4) {
                if (dst->nb[0] == 4) {
                  sVar5 = pgVar1->nb[3];
                  sVar6 = pgVar1->nb[2];
                  sVar7 = dst->nb[3];
                  sVar8 = dst->nb[2];
                  local_98 = 0;
                  sVar9 = dst->nb[1];
                  for (uVar18 = 0; uVar18 != (~((long)uVar4 >> 0x3f) & uVar4); uVar18 = uVar18 + 1)
                  {
                    lVar15 = local_98;
                    for (uVar21 = 0; uVar21 != (~((long)uVar3 >> 0x3f) & uVar3); uVar21 = uVar21 + 1
                        ) {
                      lVar14 = lVar15;
                      lVar20 = lVar15;
                      for (uVar19 = 0; uVar19 != (~((long)uVar2 >> 0x3f) & uVar2);
                          uVar19 = uVar19 + 1) {
                        pvVar10 = dst->data;
                        pvVar11 = pgVar1->data;
                        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                          *(undefined4 *)((long)pvVar10 + uVar16 * 4 + lVar14) = 0;
                        }
                        *(undefined4 *)
                         ((long)pvVar10 +
                         uVar19 * 4 + uVar19 * sVar9 + uVar21 * sVar8 + uVar18 * sVar7) =
                             *(undefined4 *)
                              ((long)pvVar11 + uVar19 * 4 + uVar21 * sVar6 + uVar18 * sVar5);
                        for (lVar12 = 1; (long)(uVar19 + lVar12) < (long)uVar2; lVar12 = lVar12 + 1)
                        {
                          *(undefined4 *)((long)pvVar10 + lVar12 * 4 + lVar20) = 0;
                        }
                        lVar20 = lVar20 + sVar9 + 4;
                        lVar14 = lVar14 + sVar9;
                      }
                      lVar15 = lVar15 + sVar8;
                    }
                    local_98 = local_98 + sVar7;
                  }
                  return;
                }
                pcVar13 = "nb0 == sizeof(float)";
                uVar17 = 0x11a2;
              }
              else {
                pcVar13 = "nb00 == sizeof(float)";
                uVar17 = 0x11a1;
              }
            }
            else {
              pcVar13 = "ne03 == ne3";
              uVar17 = 0x119f;
            }
          }
          else {
            pcVar13 = "ne02 == ne2";
            uVar17 = 0x119e;
          }
        }
        else {
          pcVar13 = "ne01 == 1";
          uVar17 = 0x119d;
        }
      }
      else {
        pcVar13 = "ne00 == ne1";
        uVar17 = 0x119c;
      }
    }
    else {
      pcVar13 = "ne00 == ne0";
      uVar17 = 0x119b;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar17,"GGML_ASSERT(%s) failed",pcVar13);
  }
  return;
}

Assistant:

void ggml_compute_forward_diag(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_diag_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}